

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall
IRT::CStatementList::CStatementList
          (CStatementList *this,
          unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *statement)

{
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_20;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *local_18;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *statement_local;
  CStatementList *this_local;
  
  local_18 = statement;
  statement_local =
       (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)this;
  CStatement::CStatement(&this->super_CStatement);
  (this->super_CStatement).super_IStatement.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00237f18;
  std::
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  ::vector(&this->statements);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_20,local_18);
  Add(this,&local_20);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

CStatementList::CStatementList( std::unique_ptr<const CStatement> &statement ) {
    Add( std::move(statement) );
}